

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

string * __thiscall
t_dart_generator::dart_thrift_imports_abi_cxx11_
          (string *__return_storage_ptr__,t_dart_generator *this)

{
  bool bVar1;
  ulong uVar2;
  vector<t_program_*,_std::allocator<t_program_*>_> *this_00;
  reference pptVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f8 [8];
  string named_import;
  string include_name;
  t_program *include;
  const_iterator __end1;
  const_iterator __begin1;
  vector<t_program_*,_std::allocator<t_program_*>_> *__range1;
  vector<t_program_*,_std::allocator<t_program_*>_> *includes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  t_dart_generator *local_18;
  t_dart_generator *this_local;
  string *imports;
  
  local_19 = 0;
  local_18 = this;
  this_local = (t_dart_generator *)__return_storage_ptr__;
  std::operator+(&local_60,"import \'dart:typed_data\' show Uint8List;",&::endl_abi_cxx11_);
  std::operator+(&local_40,&local_60,"import \'package:thrift/thrift.dart\';");
  std::operator+(__return_storage_ptr__,&local_40,&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&includes,
                   "import \'package:",&this->package_prefix_);
    std::operator+(&local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&includes,
                   &this->library_name_);
    std::operator+(&local_150,&local_170,".dart\';");
    std::operator+(&local_130,&local_150,&::endl_abi_cxx11_);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&includes);
  }
  else {
    std::operator+(&local_110,"import \'package:",&this->library_name_);
    std::operator+(&local_f0,&local_110,"/");
    std::operator+(&local_d0,&local_f0,&this->library_name_);
    std::operator+(&local_b0,&local_d0,".dart\';");
    std::operator+(&local_90,&local_b0,&::endl_abi_cxx11_);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
  }
  this_00 = t_program::get_includes((this->super_t_oop_generator).super_t_generator.program_);
  __end1 = std::vector<t_program_*,_std::allocator<t_program_*>_>::begin(this_00);
  include = (t_program *)std::vector<t_program_*,_std::allocator<t_program_*>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
                                     *)&include), bVar1) {
    pptVar3 = __gnu_cxx::
              __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
              ::operator*(&__end1);
    find_library_name_abi_cxx11_((string *)((long)&named_import.field_2 + 8),this,*pptVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                   "t_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&named_import.field_2 + 8));
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::operator+(&local_398,"import \'package:",&this->package_prefix_);
      std::operator+(&local_378,&local_398,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&named_import.field_2 + 8));
      std::operator+(&local_358,&local_378,".dart\' as ");
      std::operator+(&local_338,&local_358,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8)
      ;
      std::operator+(&local_318,&local_338,";");
      std::operator+(&local_2f8,&local_318,&::endl_abi_cxx11_);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&local_398);
    }
    else {
      std::operator+(&local_2d8,"import \'package:",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&named_import.field_2 + 8));
      std::operator+(&local_2b8,&local_2d8,"/");
      std::operator+(&local_298,&local_2b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&named_import.field_2 + 8));
      std::operator+(&local_278,&local_298,".dart\' as ");
      std::operator+(&local_258,&local_278,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8)
      ;
      std::operator+(&local_238,&local_258,";");
      std::operator+(&local_218,&local_238,&::endl_abi_cxx11_);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2d8);
    }
    std::__cxx11::string::~string((string *)local_1f8);
    std::__cxx11::string::~string((string *)(named_import.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_dart_generator::dart_thrift_imports() {
  string imports = "import 'dart:typed_data' show Uint8List;" + endl +
                   "import 'package:thrift/thrift.dart';" + endl;

  // add import for this library
  if (package_prefix_.empty()) {
    imports += "import 'package:" + library_name_ + "/" + library_name_ + ".dart';" + endl;
  } else {
    imports += "import 'package:" + package_prefix_ + library_name_ + ".dart';" + endl;
  }

  // add imports for included thrift files
  const vector<t_program*>& includes = program_->get_includes();
  for (auto include : includes) {
    string include_name = find_library_name(include);
    string named_import = "t_" + include_name;
    if (package_prefix_.empty()) {
      imports += "import 'package:" + include_name + "/" + include_name + ".dart' as " + named_import + ";" + endl;
    } else {
      imports += "import 'package:" + package_prefix_ + include_name + ".dart' as " + named_import + ";" + endl;
    }
  }

  return imports;
}